

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void reset(int size)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  memSize = size;
  for (p_Var1 = usedMemBlockList_abi_cxx11_.
                super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                super__List_node_base._M_next;
      p_Var2 = freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>
               ._M_impl._M_node.super__List_node_base._M_next,
      p_Var1 != (_List_node_base *)&usedMemBlockList_abi_cxx11_;
      p_Var1 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var1->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      operator_delete(p_Var1[1]._M_next);
    }
  }
  for (; p_Var1 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next,
      p_Var2 != (_List_node_base *)&freeMemBlockList_abi_cxx11_;
      p_Var2 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var2->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      operator_delete(p_Var2[1]._M_next);
    }
  }
  for (; p_Var2 = usedMemBlockList_abi_cxx11_.
                  super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl._M_node.
                  super__List_node_base._M_next,
      p_Var1 != (_List_node_base *)&processList_abi_cxx11_;
      p_Var1 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var1->_M_next)->_M_impl).
               _M_node.super__List_node_base._M_next) {
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      operator_delete(p_Var1[1]._M_next);
    }
  }
  while (p_Var2 != (_List_node_base *)&usedMemBlockList_abi_cxx11_) {
    p_Var1 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var2->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var2);
    p_Var2 = p_Var1;
  }
  usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&usedMemBlockList_abi_cxx11_;
  usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&usedMemBlockList_abi_cxx11_;
  usedMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node._M_size = 0;
  p_Var1 = freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var1 != (_List_node_base *)&freeMemBlockList_abi_cxx11_) {
    p_Var2 = (((_List_base<MemBlock_*,_std::allocator<MemBlock_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var2;
  }
  freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
  freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&freeMemBlockList_abi_cxx11_;
  freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node._M_size = 0;
  p_Var1 = processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var1 != (_List_node_base *)&processList_abi_cxx11_) {
    p_Var2 = (((_List_base<Process_*,_std::allocator<Process_*>_> *)&p_Var1->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var1);
    p_Var1 = p_Var2;
  }
  processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&processList_abi_cxx11_;
  processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&processList_abi_cxx11_;
  processList_abi_cxx11_.super__List_base<Process_*,_std::allocator<Process_*>_>._M_impl._M_node.
  _M_size = 0;
  p_Var1 = (_List_node_base *)operator_new(8);
  *(undefined4 *)&p_Var1->_M_next = 0;
  *(int *)((long)&p_Var1->_M_next + 4) = memSize;
  p_Var2 = (_List_node_base *)operator_new(0x18);
  p_Var2[1]._M_next = p_Var1;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl.
  _M_node._M_size =
       freeMemBlockList_abi_cxx11_.super__List_base<MemBlock_*,_std::allocator<MemBlock_*>_>._M_impl
       ._M_node._M_size + 1;
  return;
}

Assistant:

void reset(int size) {
    // 首先将内存大小设置为size
    memSize = size;

    // 清空所有链表
    for (MemBlock *i : usedMemBlockList) delete i;
    for (MemBlock *i : freeMemBlockList) delete i;
    for (Process *i : processList) delete i;
    usedMemBlockList.clear();
    freeMemBlockList.clear();
    processList.clear();

    // 添加一块大小为size的空内存至链表
    MemBlock *free = new MemBlock;
    free->start = 0;
    free->length = memSize;
    freeMemBlockList.push_back(free);
}